

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O0

uint nullcGetBytecode(char **bytecode)

{
  int iVar1;
  uint size;
  TraceScope traceScope;
  char **bytecode_local;
  
  if ((NULLC::initialized & 1) == 0) {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
    bytecode_local._4_4_ = 0;
  }
  else {
    if (nullcGetBytecode::token == '\0') {
      iVar1 = __cxa_guard_acquire(&nullcGetBytecode::token);
      if (iVar1 != 0) {
        nullcGetBytecode::token = NULLC::TraceGetToken("nullc","nullcGetBytecode");
        __cxa_guard_release(&nullcGetBytecode::token);
      }
    }
    NULLC::TraceScope::TraceScope((TraceScope *)&size,nullcGetBytecode::token);
    if (NULLC::compilerCtx == (CompilerContext *)0x0) {
      NULLC::nullcLastError = "ERROR: there is no active compiler context";
      bytecode_local._4_4_ = 0;
    }
    else {
      bytecode_local._4_4_ = GetBytecode(NULLC::compilerCtx,bytecode);
      BinaryCache::LastBytecode(*bytecode);
    }
    NULLC::TraceScope::~TraceScope((TraceScope *)&size);
  }
  return bytecode_local._4_4_;
}

Assistant:

unsigned nullcGetBytecode(char **bytecode)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(0);

	TRACE_SCOPE("nullc", "nullcGetBytecode");

	if(!compilerCtx)
	{
		nullcLastError = "ERROR: there is no active compiler context";
		return 0;
	}

	unsigned size = GetBytecode(*compilerCtx, bytecode);

	// Load it into cache
	BinaryCache::LastBytecode(*bytecode);
	return size;
}